

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.c
# Opt level: O0

BOOL MemoryEqual(void *buffer1,void *buffer2,uint size)

{
  byte *local_30;
  BYTE *b2;
  BYTE *b1;
  BYTE equal;
  uint size_local;
  void *buffer2_local;
  void *buffer1_local;
  
  b1._3_1_ = 0;
  local_30 = (byte *)buffer2;
  b2 = (BYTE *)buffer1;
  for (b1._4_4_ = size; b1._4_4_ != 0; b1._4_4_ = b1._4_4_ - 1) {
    b1._3_1_ = b1._3_1_ | *b2 ^ *local_30;
    local_30 = local_30 + 1;
    b2 = b2 + 1;
  }
  return (BOOL)(b1._3_1_ == 0);
}

Assistant:

BOOL MemoryEqual(
    const void      *buffer1,       // IN: compare buffer1
    const void      *buffer2,       // IN: compare buffer2
    unsigned int     size           // IN: size of bytes being compared
    )
{
    BYTE         equal = 0;
    const BYTE  *b1 = (BYTE *)buffer1;
    const BYTE  *b2 = (BYTE *)buffer2;
//
    // Compare all bytes so that there is no leakage of information
    // due to timing differences.
    for(; size > 0; size--)
        equal |= (*b1++ ^ *b2++);
    return (equal == 0);
}